

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O1

void __thiscall
bgui::ImageWindow::visibleImagePart(ImageWindow *this,long *x,long *y,long *w,long *h)

{
  double dVar1;
  double dVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SMatrix<long,_2,_3> *pSVar4;
  SMatrix<long,_2,_3> *pSVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  int hh;
  SVector<long,_2> p2;
  SVector<long,_2> p1;
  SVector<long,_3> q2;
  SVector<long,_3> q1;
  int ww;
  int local_c4;
  double local_c0;
  long local_b8 [8];
  long local_78 [4];
  long *local_58;
  long *local_50;
  long *local_48;
  long *local_40;
  int local_34;
  
  if (this->adapt != (ImageAdapterBase *)0x0) {
    local_58 = x;
    local_50 = y;
    local_48 = w;
    local_40 = h;
    BaseWindow::getSize(&this->super_BaseWindow,&local_34,&local_c4);
    local_c0 = this->adapt->scale;
    local_b8[6] = 0;
    local_b8[4] = 0;
    local_b8[5] = 0;
    iVar3 = this->imx;
    if (this->imx < 1) {
      iVar3 = 0;
    }
    dVar1 = (double)iVar3 / local_c0;
    iVar3 = this->imy;
    if (this->imy < 1) {
      iVar3 = 0;
    }
    dVar2 = (double)iVar3 / local_c0;
    local_78[2] = 1;
    local_78[0] = (long)dVar1;
    local_78[1] = (long)dVar2;
    iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
    lVar6 = (long)local_34;
    if (CONCAT44(extraout_var,iVar3) < (long)local_34) {
      lVar6 = CONCAT44(extraout_var,iVar3);
    }
    local_b8[4] = (long)((double)lVar6 / local_c0) + (long)dVar1;
    iVar3 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
    lVar6 = (long)local_c4;
    if (CONCAT44(extraout_var_00,iVar3) < (long)local_c4) {
      lVar6 = CONCAT44(extraout_var_00,iVar3);
    }
    local_b8[5] = (long)((double)lVar6 / local_c0) + (long)dVar2;
    local_b8[6] = 1;
    pSVar4 = &this->adapt->R;
    local_b8[2] = 0;
    local_b8[3] = 0;
    pSVar5 = pSVar4;
    lVar6 = 0;
    do {
      lVar7 = local_b8[lVar6 + 2];
      lVar8 = 0;
      do {
        lVar7 = lVar7 + local_78[lVar8] * pSVar5->v[0][lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      local_b8[lVar6 + 2] = lVar7;
      pSVar5 = (SMatrix<long,_2,_3> *)(pSVar5->v + 1);
      bVar9 = lVar6 == 0;
      lVar6 = lVar6 + 1;
    } while (bVar9);
    local_b8[0] = 0;
    local_b8[1] = 0;
    lVar6 = 0;
    do {
      lVar7 = local_b8[lVar6];
      lVar8 = 0;
      do {
        lVar7 = lVar7 + local_b8[lVar8 + 4] * pSVar4->v[0][lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      local_b8[lVar6] = lVar7;
      pSVar4 = (SMatrix<long,_2,_3> *)(pSVar4->v + 1);
      bVar9 = lVar6 == 0;
      lVar6 = lVar6 + 1;
    } while (bVar9);
    lVar6 = local_b8[2];
    if (local_b8[0] < local_b8[2]) {
      lVar6 = local_b8[0];
    }
    *local_58 = lVar6;
    lVar6 = local_b8[3];
    if (local_b8[1] < local_b8[3]) {
      lVar6 = local_b8[1];
    }
    *local_50 = lVar6;
    if (local_b8[0] < local_b8[2]) {
      local_b8[0] = local_b8[2];
    }
    if (local_b8[1] < local_b8[3]) {
      local_b8[1] = local_b8[3];
    }
    *local_48 = local_b8[0] - *local_58;
    *local_40 = local_b8[1] - *local_50;
    return;
  }
  *y = 0;
  *x = 0;
  *h = -1;
  *w = -1;
  return;
}

Assistant:

void ImageWindow::visibleImagePart(long &x, long &y, long &w, long &h)
{
  if (adapt != 0)
  {
    int ww, hh;
    getSize(ww, hh);

    double scale=adapt->getScale();

    gmath::SVector<long, 3> q1, q2;

    q1[0]=static_cast<long>(std::max(imx, 0)/scale);
    q1[1]=static_cast<long>(std::max(imy, 0)/scale);
    q1[2]=1;

    q2[0]=q1[0]+static_cast<long>(std::min(static_cast<long>(ww), adapt->getWidth())/scale);
    q2[1]=q1[1]+static_cast<long>(std::min(static_cast<long>(hh), adapt->getHeight())/scale);
    q2[2]=1;

    const gmath::SVector<long, 2> p1=adapt->getRotationMatrix()*q1;
    const gmath::SVector<long, 2> p2=adapt->getRotationMatrix()*q2;

    x=std::min(p1[0], p2[0]);
    y=std::min(p1[1], p2[1]);
    w=std::max(p1[0], p2[0])-x;
    h=std::max(p1[1], p2[1])-y;
  }
  else
  {
    x=y=0;
    w=h=-1;
  }
}